

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_serialize(void)

{
  _Bool _Var1;
  uint uVar2;
  roaring_bitmap_t *prVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  roaring_bitmap_t *prVar7;
  uint64_t uVar8;
  uint32_t *puVar9;
  uint64_t uVar10;
  uint32_t *puVar11;
  run_container_t *run;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar12;
  uint32_t k;
  uint32_t uVar13;
  int iVar14;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_48 = 0x3e800000064;
  uStack_40 = 0xf424000002710;
  local_58 = 0x100000000;
  uStack_50 = 0x300000002;
  local_38 = 20000000;
  prVar3 = roaring_bitmap_of_ptr(8,(uint32_t *)((long)&local_58 + 4));
  _assert_true((unsigned_long)prVar3,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x592);
  for (uVar13 = 0; uVar13 != 0x119400; uVar13 = uVar13 + 3) {
    roaring_bitmap_add(prVar3,uVar13);
  }
  sVar4 = roaring_bitmap_size_in_bytes(prVar3);
  pcVar5 = (char *)malloc(sVar4);
  sVar4 = roaring_bitmap_serialize(prVar3,pcVar5);
  sVar6 = roaring_bitmap_size_in_bytes(prVar3);
  _assert_int_equal(sVar4 & 0xffffffff,sVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x59d);
  prVar7 = roaring_bitmap_deserialize(pcVar5);
  _assert_true((unsigned_long)prVar7,"r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x59f);
  uVar8 = roaring_bitmap_get_cardinality(prVar3);
  puVar9 = (uint32_t *)malloc(uVar8 * 4);
  roaring_bitmap_to_uint32_array(prVar3,puVar9);
  uVar10 = roaring_bitmap_get_cardinality(prVar7);
  puVar11 = (uint32_t *)malloc(uVar10 * 4);
  roaring_bitmap_to_uint32_array(prVar7,puVar11);
  uVar2 = array_equals(puVar9,(int32_t)uVar8,puVar11,(int32_t)uVar10);
  _assert_true((ulong)uVar2,"array_equals(arr1, card1, arr2, card2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5a9);
  _Var1 = roaring_bitmap_equals(prVar3,prVar7);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5aa);
  free(puVar9);
  free(puVar11);
  free(pcVar5);
  roaring_bitmap_free(prVar3);
  roaring_bitmap_free(prVar7);
  run = run_container_create_given_capacity(0x400);
  _assert_true((unsigned_long)run,"run",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5b3);
  for (iVar14 = 0; iVar14 != 0x900; iVar14 = iVar14 + 3) {
    run_container_add(run,(uint16_t)iVar14);
  }
  ra = &roaring_bitmap_create_with_capacity(1)->high_low_container;
  ra_append(ra,0,run,'\x03');
  sVar4 = roaring_bitmap_size_in_bytes((roaring_bitmap_t *)ra);
  iVar14 = (int)sVar4;
  pcVar5 = (char *)malloc(sVar4 & 0xffffffff);
  sVar6 = roaring_bitmap_serialize((roaring_bitmap_t *)ra,pcVar5);
  _assert_int_equal((long)iVar14,sVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x5bc);
  prVar3 = roaring_bitmap_deserialize(pcVar5);
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)ra,prVar3);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5be);
  prVar7 = roaring_bitmap_deserialize_safe(pcVar5,0);
  _assert_true((ulong)(prVar7 == (roaring_bitmap_t *)0x0),
               "roaring_bitmap_deserialize_safe(serialized, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5c2);
  prVar7 = roaring_bitmap_deserialize_safe(pcVar5,(ulong)(iVar14 - 1));
  _assert_true((ulong)(prVar7 == (roaring_bitmap_t *)0x0),
               "roaring_bitmap_deserialize_safe(serialized, serialize_len - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5c3);
  prVar7 = roaring_bitmap_deserialize_safe(pcVar5,sVar4 & 0xffffffff);
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)ra,prVar7);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, t_safe)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5c9);
  roaring_bitmap_free(prVar7);
  prVar7 = roaring_bitmap_deserialize_safe(pcVar5,(ulong)(iVar14 + 10));
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)ra,prVar7);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, t_safe)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5cf);
  roaring_bitmap_free(prVar7);
  free(pcVar5);
  roaring_bitmap_free((roaring_bitmap_t *)ra);
  roaring_bitmap_free(prVar3);
  uStack_68 = 0xa01173;
  uStack_64 = 0x12f24cb00a0412c;
  local_78 = 0x2cf3d000000000;
  uStack_70 = 0x2dbcf3;
  uStack_6c = 0x9fe2d1;
  prVar3 = roaring_bitmap_of_ptr(6,(uint32_t *)((long)&local_78 + 4));
  sVar4 = roaring_bitmap_size_in_bytes(prVar3);
  pcVar5 = (char *)malloc(sVar4);
  sVar4 = roaring_bitmap_serialize(prVar3,pcVar5);
  sVar6 = roaring_bitmap_size_in_bytes(prVar3);
  _assert_int_equal(sVar4 & 0xffffffff,sVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x5db);
  prVar7 = roaring_bitmap_deserialize(pcVar5);
  _assert_true((unsigned_long)prVar7,"r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5dd);
  uVar8 = roaring_bitmap_get_cardinality(prVar3);
  puVar9 = (uint32_t *)malloc(uVar8 * 4);
  _assert_true((unsigned_long)puVar9,"arr1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5e1);
  roaring_bitmap_to_uint32_array(prVar3,puVar9);
  uVar10 = roaring_bitmap_get_cardinality(prVar7);
  puVar11 = (uint32_t *)malloc(uVar10 * 4);
  _assert_true((unsigned_long)puVar11,"arr2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5e6);
  roaring_bitmap_to_uint32_array(prVar7,puVar11);
  uVar2 = array_equals(puVar9,(int32_t)uVar8,puVar11,(int32_t)uVar10);
  _assert_true((ulong)uVar2,"array_equals(arr1, card1, arr2, card2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5e9);
  _Var1 = roaring_bitmap_equals(prVar3,prVar7);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5ea);
  free(puVar9);
  free(puVar11);
  free(pcVar5);
  roaring_bitmap_free(prVar3);
  roaring_bitmap_free(prVar7);
  prVar3 = roaring_bitmap_create();
  for (uVar13 = 100; uVar13 != 100000; uVar13 = uVar13 + 1) {
    roaring_bitmap_add(prVar3,uVar13);
  }
  roaring_bitmap_run_optimize(prVar3);
  sVar4 = roaring_bitmap_size_in_bytes(prVar3);
  pcVar5 = (char *)malloc(sVar4);
  sVar4 = roaring_bitmap_serialize(prVar3,pcVar5);
  sVar6 = roaring_bitmap_size_in_bytes(prVar3);
  _assert_int_equal(sVar4 & 0xffffffff,sVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x5f8);
  prVar7 = roaring_bitmap_deserialize(pcVar5);
  uVar8 = roaring_bitmap_get_cardinality(prVar3);
  puVar9 = (uint32_t *)malloc(uVar8 * 4);
  _assert_true((unsigned_long)puVar9,"arr1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x5fd);
  roaring_bitmap_to_uint32_array(prVar3,puVar9);
  uVar10 = roaring_bitmap_get_cardinality(prVar7);
  puVar11 = (uint32_t *)malloc(uVar10 * 4);
  _assert_true((unsigned_long)puVar11,"arr2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x602);
  roaring_bitmap_to_uint32_array(prVar7,puVar11);
  uVar2 = array_equals(puVar9,(int32_t)uVar8,puVar11,(int32_t)uVar10);
  _assert_true((ulong)uVar2,"array_equals(arr1, card1, arr2, card2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x605);
  _Var1 = roaring_bitmap_equals(prVar3,prVar7);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x606);
  free(puVar9);
  free(puVar11);
  free(pcVar5);
  roaring_bitmap_free(prVar3);
  roaring_bitmap_free(prVar7);
  prVar3 = roaring_bitmap_create();
  for (uVar13 = 0; uVar13 != 0x66; uVar13 = uVar13 + 1) {
    roaring_bitmap_add(prVar3,uVar13);
  }
  sVar4 = roaring_bitmap_size_in_bytes(prVar3);
  pcVar5 = (char *)malloc(sVar4);
  sVar4 = roaring_bitmap_serialize(prVar3,pcVar5);
  sVar6 = roaring_bitmap_size_in_bytes(prVar3);
  _assert_int_equal(sVar4 & 0xffffffff,sVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x613);
  prVar7 = roaring_bitmap_deserialize(pcVar5);
  prVar12 = roaring_bitmap_deserialize_safe(pcVar5,(ulong)((int)sVar4 - 1));
  _assert_true((ulong)(prVar12 == (roaring_bitmap_t *)0x0),
               "roaring_bitmap_deserialize_safe(buff, size - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x617);
  prVar12 = roaring_bitmap_deserialize_safe(pcVar5,sVar4 & 0xffffffff);
  _Var1 = roaring_bitmap_equals(prVar7,prVar12);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(new_bm, t_safe)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x61a);
  roaring_bitmap_free(prVar12);
  free(pcVar5);
  uVar8 = roaring_bitmap_get_cardinality(prVar3);
  uVar10 = roaring_bitmap_get_cardinality(prVar7);
  _assert_true((ulong)((int)uVar8 == (int)uVar10),
               "(unsigned int)roaring_bitmap_get_cardinality(old_bm) == (unsigned int)roaring_bitmap_get_cardinality(new_bm)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x61f);
  _Var1 = roaring_bitmap_equals(prVar3,prVar7);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(old_bm, new_bm)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x620);
  roaring_bitmap_free(prVar3);
  roaring_bitmap_free(prVar7);
  return;
}

Assistant:

DEFINE_TEST(test_serialize) {
    roaring_bitmap_t *r1 =
        roaring_bitmap_from(1, 2, 3, 100, 1000, 10000, 1000000, 20000000);
    assert_non_null(r1);

    uint32_t serialize_len;
    char *serialized;
    roaring_bitmap_t *r2;

    /* Add some values to the bitmap */
    for (int i = 0, top_val = 384000; i < top_val; i++)
        roaring_bitmap_add(r1, 3 * i);
    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_non_null(r2);

    uint64_t card1 = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r1, arr1);

    uint64_t card2 = roaring_bitmap_get_cardinality(r2);
    uint32_t *arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));
    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    /* manually create a run container, and inject ito a roaring bitmap */
    run_container_t *run = run_container_create_given_capacity(1024);
    assert_non_null(run);
    for (int i = 0; i < 768; i++) run_container_add(run, 3 * i);

    r1 = roaring_bitmap_create_with_capacity(1);
    ra_append(&r1->high_low_container, 0, run, RUN_CONTAINER_TYPE);

    serialize_len = roaring_bitmap_size_in_bytes(r1);
    serialized = (char *)malloc(serialize_len);
    assert_int_equal((int32_t)serialize_len,
                     roaring_bitmap_serialize(r1, serialized));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_true(roaring_bitmap_equals(r1, r2));

    // Check that roaring_bitmap_deserialize_safe fails on invalid length

    assert_null(roaring_bitmap_deserialize_safe(serialized, 0));
    assert_null(roaring_bitmap_deserialize_safe(serialized, serialize_len - 1));

    // Check that roaring_bitmap_deserialize_safe succeed with valid length

    roaring_bitmap_t *t_safe =
        roaring_bitmap_deserialize_safe(serialized, serialize_len);
    assert_true(roaring_bitmap_equals(r1, t_safe));
    roaring_bitmap_free(t_safe);

    // Check that roaring_bitmap_deserialize_safe succeed with larger length

    t_safe = roaring_bitmap_deserialize_safe(serialized, serialize_len + 10);
    assert_true(roaring_bitmap_equals(r1, t_safe));
    roaring_bitmap_free(t_safe);

    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    r1 = roaring_bitmap_from(2946000, 2997491, 10478289, 10490227, 10502444,
                             19866827);

    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_non_null(r2);

    card1 = roaring_bitmap_get_cardinality(r1);
    arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_non_null(arr1);
    roaring_bitmap_to_uint32_array(r1, arr1);

    card2 = roaring_bitmap_get_cardinality(r2);
    arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    assert_non_null(arr2);
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));
    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    r1 = roaring_bitmap_create();
    for (uint32_t k = 100; k < 100000; ++k) {
        roaring_bitmap_add(r1, k);
    }
    roaring_bitmap_run_optimize(r1);
    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);

    card1 = roaring_bitmap_get_cardinality(r1);
    arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_non_null(arr1);
    roaring_bitmap_to_uint32_array(r1, arr1);

    card2 = roaring_bitmap_get_cardinality(r2);
    arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    assert_non_null(arr2);
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));

    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    /* ******* */
    roaring_bitmap_t *old_bm = roaring_bitmap_create();
    for (unsigned i = 0; i < 102; i++) roaring_bitmap_add(old_bm, i);
    char *buff = (char *)malloc(roaring_bitmap_size_in_bytes(old_bm));
    uint32_t size = roaring_bitmap_serialize(old_bm, buff);
    assert_int_equal(size, roaring_bitmap_size_in_bytes(old_bm));
    roaring_bitmap_t *new_bm = roaring_bitmap_deserialize(buff);

    // Check that roaring_bitmap_deserialize_safe fails on invalid length
    assert_null(roaring_bitmap_deserialize_safe(buff, size - 1));
    // Check that roaring_bitmap_deserialize_safe succeed with valid length
    t_safe = roaring_bitmap_deserialize_safe(buff, size);
    assert_true(roaring_bitmap_equals(new_bm, t_safe));
    roaring_bitmap_free(t_safe);

    free(buff);
    assert_true((unsigned int)roaring_bitmap_get_cardinality(old_bm) ==
                (unsigned int)roaring_bitmap_get_cardinality(new_bm));
    assert_true(roaring_bitmap_equals(old_bm, new_bm));
    roaring_bitmap_free(old_bm);
    roaring_bitmap_free(new_bm);
}